

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O2

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstruct<float>_>::CopyFrom
          (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *this,TPZMatrix<float> *mat)

{
  TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *pTVar1;
  
  if (mat != (TPZMatrix<float> *)0x0) {
    pTVar1 = (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *)
             __dynamic_cast(mat,&TPZMatrix<float>::typeinfo,
                            &TPZDohrPrecond<float,TPZDohrSubstruct<float>>::typeinfo,0);
    if (pTVar1 != (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *)0x0) {
      operator=(this,pTVar1);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZDohrPrecond<float, TPZDohrSubstruct<float>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = float, TSubStruct = TPZDohrSubstruct<float>]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SubStruct/tpzdohrprecond.h"
             ,0x50);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZDohrPrecond<TVar,TSubStruct> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }